

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll_set.cpp
# Opt level: O2

void __thiscall miniros::PollSet::createNativePollset(PollSet *this)

{
  _Base_ptr p_Var1;
  short *psVar2;
  
  std::mutex::lock(&this->socket_info_mutex_);
  if (this->sockets_changed_ == true) {
    std::vector<pollfd,_std::allocator<pollfd>_>::resize
              (&this->ufds_,(this->socket_info_)._M_t._M_impl.super__Rb_tree_header._M_node_count);
    p_Var1 = (this->socket_info_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    psVar2 = &((this->ufds_).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
               super__Vector_impl_data._M_start)->revents;
    while ((_Rb_tree_header *)p_Var1 != &(this->socket_info_)._M_t._M_impl.super__Rb_tree_header) {
      ((pollfd *)(psVar2 + -3))->fd = *(int *)&p_Var1[2]._M_right;
      psVar2[-1] = *(short *)((long)&p_Var1[2]._M_right + 4);
      *psVar2 = 0;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var1);
      psVar2 = psVar2 + 4;
    }
    this->sockets_changed_ = false;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->socket_info_mutex_);
  return;
}

Assistant:

void PollSet::createNativePollset()
{
  std::scoped_lock<std::mutex> lock(socket_info_mutex_);

  if (!sockets_changed_)
  {
    return;
  }

  // Build the list of structures to pass to poll for the sockets we're servicing
  ufds_.resize(socket_info_.size());
  M_SocketInfo::iterator sock_it = socket_info_.begin();
  M_SocketInfo::iterator sock_end = socket_info_.end();
  for (int i = 0; sock_it != sock_end; ++sock_it, ++i)
  {
    const SocketInfo& info = sock_it->second;
    socket_pollfd& pfd = ufds_[i];
    pfd.fd = info.fd_;
    pfd.events = info.events_;
    pfd.revents = 0;
  }
  sockets_changed_ = false;
}